

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcalc.cpp
# Opt level: O0

int main(void)

{
  char *pcVar1;
  bool bVar2;
  __uid_t __uid;
  allocator local_161;
  string local_160;
  char *local_140;
  char *line;
  passwd *local_118;
  passwd *pw;
  allocator local_f9;
  undefined1 local_f8 [8];
  string homeDir;
  Calculator calculator;
  
  Calculator::Calculator((Calculator *)((long)&homeDir.field_2 + 8),(ostream *)&std::cout);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_f8,"",&local_f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  __uid = getuid();
  local_118 = getpwuid(__uid);
  std::__cxx11::string::operator=((string *)local_f8,local_118->pw_dir);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 "/default.termcalc");
  Calculator::loadFile((Calculator *)((long)&homeDir.field_2 + 8),(string *)&line,false);
  std::__cxx11::string::~string((string *)&line);
  while (local_140 = linenoise("> "), local_140 != (char *)0x0) {
    linenoiseHistoryAdd(local_140);
    pcVar1 = local_140;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,pcVar1,&local_161);
    bVar2 = Calculator::execute((Calculator *)((long)&homeDir.field_2 + 8),&local_160,true);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    if (bVar2) break;
    free(local_140);
  }
  std::__cxx11::string::~string((string *)local_f8);
  Calculator::~Calculator((Calculator *)((long)&homeDir.field_2 + 8));
  return 0;
}

Assistant:

int main() {
	Calculator calculator;
	std::string homeDir = "";

	#ifdef __unix__
	struct passwd *pw = getpwuid(getuid());
	homeDir = pw->pw_dir;
	#endif

	#if defined(_WIN64) || defined(__MINGW32__)
	PWSTR path = nullptr;
	if (SUCCEEDED(SHGetKnownFolderPath(FOLDERID_Profile, 0, nullptr, &path))) {
		using convert_typeX = std::codecvt_utf8<wchar_t>;
		std::wstring_convert<convert_typeX, wchar_t> converterX;
		homeDir = converterX.to_bytes(std::wstring(path));
	}
	CoTaskMemFree(path);
	#endif

	calculator.loadFile(homeDir + "/default.termcalc", false);

	#if __unix__
		char* line;
		while((line = linenoise("> ")) != nullptr) {
			linenoiseHistoryAdd(line);
			if (calculator.execute(line)) {
				break;
			}
			free(line);
		}
	#else
		std::string line;
		while (std::cin) {
			std::cout << "> ";
			std::getline(std::cin, line);
			if (calculator.execute(line)) {
				break;
			}
		}
	#endif
}